

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLLinOp::make
          (MLLinOp *this,
          Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
          *mf,IntVect *ng)

{
  vector<amrex::Any,_std::allocator<amrex::Any>_> *pvVar1;
  vector<amrex::Any,_std::allocator<amrex::Any>_> *pvVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  long *in_RAX;
  pointer piVar6;
  pointer *__ptr;
  ulong uVar7;
  vector<amrex::Any,_std::allocator<amrex::Any>_> *this_00;
  ulong uVar8;
  long *local_38;
  
  pvVar1 = &((mf->
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             ).
             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_vector<amrex::Any,_std::allocator<amrex::Any>_>;
  pvVar2 = &((mf->
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             ).
             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_vector<amrex::Any,_std::allocator<amrex::Any>_>;
  this_00 = pvVar1;
  local_38 = in_RAX;
  if (pvVar2 != pvVar1) {
    do {
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar2);
    (mf->
    super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ).
    super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar1;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&mf->
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(long)this->m_num_amr_levels);
  if (0 < this->m_num_amr_levels) {
    piVar6 = (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
                (&(mf->
                  super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)piVar6[uVar8]);
      piVar6 = (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (0 < piVar6[uVar8]) {
        uVar7 = 0;
        do {
          (*this->_vptr_MLLinOp[0x27])(&local_38,this,uVar8 & 0xffffffff,uVar7 & 0xffffffff,ng);
          plVar5 = local_38;
          lVar3 = *(long *)&(mf->
                            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ).
                            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
          local_38 = (long *)0x0;
          plVar4 = *(long **)(lVar3 + uVar7 * 8);
          *(long **)(lVar3 + uVar7 * 8) = plVar5;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x10))();
          }
          if (local_38 != (long *)0x0) {
            (**(code **)(*local_38 + 0x10))();
          }
          uVar7 = uVar7 + 1;
          piVar6 = (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        } while ((long)uVar7 < (long)piVar6[uVar8]);
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)this->m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLLinOp::make (Vector<Vector<Any> >& mf, IntVect const& ng) const
{
    mf.clear();
    mf.resize(m_num_amr_levels);
    for (int alev = 0; alev < m_num_amr_levels; ++alev)
    {
        mf[alev].resize(m_num_mg_levels[alev]);
        for (int mlev = 0; mlev < m_num_mg_levels[alev]; ++mlev)
        {
            mf[alev][mlev] = AnyMake(alev, mlev, ng);
        }
    }
}